

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

_Bool upscale_normative_rect
                (uint8_t *input,int height,int width,int in_stride,uint8_t *output,int height2,
                int width2,int out_stride,int x_step_qn,int x0_qn,int pad_left,int pad_right)

{
  long lVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint8_t *in_R8;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int i_3;
  int i_2;
  int i_1;
  int i;
  uint8_t *in_tr;
  uint8_t *in_tl;
  uint8_t *tmp_right;
  uint8_t *tmp_left;
  int border_cols;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  void *local_48;
  void *local_40;
  
  local_40 = (void *)0x0;
  local_48 = (void *)0x0;
  lVar1 = in_RDI + -5;
  lVar2 = in_RDI + in_EDX;
  if (i_1 != 0) {
    local_40 = aom_malloc(0x6e7e93);
    if (local_40 == (void *)0x0) {
      return false;
    }
    for (local_5c = 0; local_5c < in_ESI; local_5c = local_5c + 1) {
      *(undefined4 *)((long)local_40 + (long)(local_5c * 5)) =
           *(undefined4 *)(lVar1 + local_5c * in_ECX);
      *(undefined1 *)((long)local_40 + (long)(local_5c * 5) + 4) =
           *(undefined1 *)(in_RDI + -1 + (long)(local_5c * in_ECX));
      memset((void *)(lVar1 + local_5c * in_ECX),(uint)*(byte *)(in_RDI + local_5c * in_ECX),5);
    }
  }
  if ((int)in_tr != 0) {
    local_48 = aom_malloc(0x6e7f48);
    if (local_48 == (void *)0x0) {
      aom_free((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      return false;
    }
    for (local_60 = 0; local_60 < in_ESI; local_60 = local_60 + 1) {
      *(undefined4 *)((long)local_48 + (long)(local_60 * 5)) =
           *(undefined4 *)(lVar2 + local_60 * in_ECX);
      *(undefined1 *)((long)local_48 + (long)(local_60 * 5) + 4) =
           *(undefined1 *)(lVar2 + 4 + (long)(local_60 * in_ECX));
      memset((void *)(lVar2 + local_60 * in_ECX),
             (uint)*(byte *)(in_RDI + (local_60 * in_ECX + in_EDX + -1)),5);
    }
  }
  (*av1_convolve_horiz_rs)
            ((uint8_t *)(in_RDI + -1),in_ECX,in_R8,in_stack_00000010,in_stack_00000008,in_R9D,
             av1_resize_filter_normative[0],i_3,in_stack_00000018);
  if (i_1 != 0) {
    for (local_64 = 0; local_64 < in_ESI; local_64 = local_64 + 1) {
      *(undefined4 *)(lVar1 + local_64 * in_ECX) =
           *(undefined4 *)((long)local_40 + (long)(local_64 * 5));
      *(undefined1 *)(in_RDI + -1 + (long)(local_64 * in_ECX)) =
           *(undefined1 *)((long)local_40 + (long)(local_64 * 5) + 4);
    }
    aom_free((void *)CONCAT44(in_stack_ffffffffffffff84,i_3));
  }
  if ((int)in_tr != 0) {
    for (local_68 = 0; local_68 < in_ESI; local_68 = local_68 + 1) {
      *(undefined4 *)(lVar2 + local_68 * in_ECX) =
           *(undefined4 *)((long)local_48 + (long)(local_68 * 5));
      *(undefined1 *)(lVar2 + 4 + (long)(local_68 * in_ECX)) =
           *(undefined1 *)((long)local_48 + (long)(local_68 * 5) + 4);
    }
    aom_free((void *)CONCAT44(in_stack_ffffffffffffff84,i_3));
  }
  return true;
}

Assistant:

static bool upscale_normative_rect(const uint8_t *const input, int height,
                                   int width, int in_stride, uint8_t *output,
                                   int height2, int width2, int out_stride,
                                   int x_step_qn, int x0_qn, int pad_left,
                                   int pad_right) {
  assert(width > 0);
  assert(height > 0);
  assert(width2 > 0);
  assert(height2 > 0);
  assert(height2 == height);

  // Extend the left/right pixels of the tile column if needed
  // (either because we can't sample from other tiles, or because we're at
  // a frame edge).
  // Save the overwritten pixels into tmp_left and tmp_right.
  // Note: Because we pass input-1 to av1_convolve_horiz_rs, we need one extra
  // column of border pixels compared to what we'd naively think.
  const int border_cols = UPSCALE_NORMATIVE_TAPS / 2 + 1;
  uint8_t *tmp_left =
      NULL;  // Silence spurious "may be used uninitialized" warnings
  uint8_t *tmp_right = NULL;
  uint8_t *const in_tl = (uint8_t *)(input - border_cols);  // Cast off 'const'
  uint8_t *const in_tr = (uint8_t *)(input + width);
  if (pad_left) {
    tmp_left = (uint8_t *)aom_malloc(sizeof(*tmp_left) * border_cols * height);
    if (!tmp_left) return false;
    for (int i = 0; i < height; i++) {
      memcpy(tmp_left + i * border_cols, in_tl + i * in_stride, border_cols);
      memset(in_tl + i * in_stride, input[i * in_stride], border_cols);
    }
  }
  if (pad_right) {
    tmp_right =
        (uint8_t *)aom_malloc(sizeof(*tmp_right) * border_cols * height);
    if (!tmp_right) {
      aom_free(tmp_left);
      return false;
    }
    for (int i = 0; i < height; i++) {
      memcpy(tmp_right + i * border_cols, in_tr + i * in_stride, border_cols);
      memset(in_tr + i * in_stride, input[i * in_stride + width - 1],
             border_cols);
    }
  }

  av1_convolve_horiz_rs(input - 1, in_stride, output, out_stride, width2,
                        height2, &av1_resize_filter_normative[0][0], x0_qn,
                        x_step_qn);

  // Restore the left/right border pixels
  if (pad_left) {
    for (int i = 0; i < height; i++) {
      memcpy(in_tl + i * in_stride, tmp_left + i * border_cols, border_cols);
    }
    aom_free(tmp_left);
  }
  if (pad_right) {
    for (int i = 0; i < height; i++) {
      memcpy(in_tr + i * in_stride, tmp_right + i * border_cols, border_cols);
    }
    aom_free(tmp_right);
  }
  return true;
}